

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall higan::Timer::~Timer(Timer *this)

{
  Timer *this_local;
  
  std::function<void_(const_higan::Timer_&)>::~function(&this->timer_callback_);
  TimeStamp::~TimeStamp(&this->expire_time_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Timer::~Timer()
{

}